

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O2

bool __thiscall pg::SSISolver::si_val_less(SSISolver *this,int a,int b)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  if (a != b) {
    uVar1 = this->k;
    uVar3 = (ulong)uVar1;
    while (iVar2 = 0, 0 < (int)uVar3) {
      if (a != -1) {
        iVar2 = this->val[(long)(int)(uVar1 * a) + (uVar3 - 1)];
      }
      if (b == -1) {
        iVar4 = 0;
      }
      else {
        iVar4 = this->val[(long)(int)(uVar1 * b) + (uVar3 - 1)];
      }
      uVar3 = uVar3 - 1;
      if (iVar2 != iVar4) {
        if ((uVar3 & 1) != 0) {
          return iVar4 < iVar2;
        }
        return iVar2 < iVar4;
      }
    }
  }
  return false;
}

Assistant:

bool
SSISolver::si_val_less(int a, int b)
{
    // if a == b, then of course return false
    if (a == b) return false;
    const int *a_val = val + k*a;
    const int *b_val = val + k*b;
    // find highest priority where they differ
    for (int i=k-1; i>=0; i--) {
        const int a_i = a == -1 ? 0 : a_val[i];
        const int b_i = b == -1 ? 0 : b_val[i];
        if (a_i == b_i) continue;
        if (i&1) return a_i > b_i; // for odd priorities
        else return a_i < b_i;     // for even priorities
    }
    // equal
    return false;
}